

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecWrd.h
# Opt level: O1

Vec_Wrd_t * Vec_WrdReadHex(char *pFileName,int *pnWords,int fVerbose)

{
  uint uVar1;
  char cVar2;
  uint uVar3;
  FILE *__stream;
  Vec_Wrd_t *pVVar4;
  word *pwVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  
  __stream = fopen(pFileName,"rb");
  if (__stream == (FILE *)0x0) {
    pVVar4 = (Vec_Wrd_t *)0x0;
    printf("Cannot open file \"%s\" for reading.\n",pFileName);
  }
  else {
    pVVar4 = (Vec_Wrd_t *)malloc(0x10);
    pVVar4->nCap = 1000;
    pVVar4->nSize = 0;
    pwVar5 = (word *)malloc(8000);
    pVVar4->pArray = pwVar5;
    uVar3 = fgetc(__stream);
    uVar7 = 0xffffffff;
    if (uVar3 != 0xffffffff) {
      uVar9 = 0;
      iVar8 = 0;
      do {
        while( true ) {
          if ((uVar3 == 10) && (uVar7 == 0xffffffff)) {
            uVar7 = pVVar4->nSize;
          }
          if ((0x20 < uVar3) || ((0x100002600U >> ((ulong)uVar3 & 0x3f) & 1) == 0)) break;
          uVar3 = fgetc(__stream);
          if (uVar3 == 0xffffffff) goto LAB_00293d58;
        }
        cVar2 = (char)uVar3;
        iVar6 = -0x30;
        if ((9 < (byte)(cVar2 - 0x30U)) &&
           ((iVar6 = -0x37, 5 < (byte)(cVar2 + 0xbfU) && (iVar6 = -0x57, 5 < (byte)(cVar2 + 0x9fU)))
           )) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                        ,0x506,"int Vec_WrdReadHexOne(char)");
        }
        uVar9 = (ulong)(uint)(cVar2 + iVar6) << ((char)iVar8 * '\x04' & 0x3fU) | uVar9;
        if (iVar8 < 0xf) {
          iVar8 = iVar8 + 1;
        }
        else {
          uVar3 = pVVar4->nSize;
          uVar1 = pVVar4->nCap;
          if (uVar3 == uVar1) {
            if ((int)uVar1 < 0x10) {
              if (pVVar4->pArray == (word *)0x0) {
                pwVar5 = (word *)malloc(0x80);
              }
              else {
                pwVar5 = (word *)realloc(pVVar4->pArray,0x80);
              }
              pVVar4->pArray = pwVar5;
              iVar8 = 0x10;
            }
            else {
              iVar8 = uVar1 * 2;
              if (iVar8 <= (int)uVar1) goto LAB_00293d27;
              if (pVVar4->pArray == (word *)0x0) {
                pwVar5 = (word *)malloc((ulong)uVar1 << 4);
              }
              else {
                pwVar5 = (word *)realloc(pVVar4->pArray,(ulong)uVar1 << 4);
              }
              pVVar4->pArray = pwVar5;
            }
            if (pwVar5 == (word *)0x0) {
              __assert_fail("p->pArray",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                            ,0x205,"void Vec_WrdGrow(Vec_Wrd_t *, int)");
            }
            pVVar4->nCap = iVar8;
          }
LAB_00293d27:
          pVVar4->nSize = uVar3 + 1;
          pVVar4->pArray[(int)uVar3] = uVar9;
          iVar8 = 0;
          uVar9 = 0;
        }
        uVar3 = fgetc(__stream);
      } while (uVar3 != 0xffffffff);
    }
LAB_00293d58:
    iVar8 = pVVar4->nSize;
    if (iVar8 % (int)uVar7 != 0) {
      __assert_fail("Vec_WrdSize(p) % nWords == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                    ,0x522,"Vec_Wrd_t *Vec_WrdReadHex(char *, int *, int)");
    }
    fclose(__stream);
    printf("Read %d words of simulation data for %d objects.\n",(ulong)uVar7,
           (long)iVar8 / (long)(int)uVar7 & 0xffffffff);
  }
  return pVVar4;
}

Assistant:

static inline Vec_Wrd_t * Vec_WrdReadHex( char * pFileName, int * pnWords, int fVerbose )
{
    Vec_Wrd_t * p = NULL; 
    int c, nWords = -1, nChars = 0; word Num = 0;
    FILE * pFile = fopen( pFileName, "rb" );
    if ( pFile == NULL )
    {
        printf( "Cannot open file \"%s\" for reading.\n", pFileName );
        return NULL;
    }
    p = Vec_WrdAlloc( 1000 );
    while ( (c = fgetc(pFile)) != EOF )
    {
        if ( c == '\n' && nWords == -1 )
            nWords = Vec_WrdSize(p);
        if ( c == '\n' || c == '\r' || c == '\t' || c == ' ' )
            continue;
        Num |= (word)Vec_WrdReadHexOne((char)c) << (nChars * 4);
        if ( ++nChars < 16 )
            continue;
        Vec_WrdPush( p, Num );
        nChars = 0; 
        Num = 0;
    }
    assert( Vec_WrdSize(p) % nWords == 0 );
    fclose( pFile );
    if ( pnWords )
        *pnWords = nWords;
    if ( fVerbose )
        printf( "Read %d words of simulation data for %d objects.\n", nWords, Vec_WrdSize(p)/nWords );
    return p;
}